

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

void __thiscall CMainParams::CMainParams(CMainParams *this)

{
  map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  *this_00;
  uint256 *puVar1;
  CBlock *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  pointer puVar2;
  base_blob<256U> *pbVar3;
  bool bVar4;
  CAmount *in_R9;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_int,_uint256>_> __l;
  allocator_type local_22a;
  allocator_type local_229;
  CBlock local_228 [4];
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = MAIN;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar2 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  local_228[0].super_CBlockHeader.nVersion = -0x53b063de;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0x88;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xba;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xb1;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0x94;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xeb;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\b';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xf1;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 0xa5;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '(';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xcc;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x8d;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0xed;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '#';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 0x97;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xf4;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf4;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xeb;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 'n';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 'u';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = 0xdc;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\x02'
  ;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  this_00 = &(this->super_CChainParams).consensus.script_flag_exceptions;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_48._M_impl._0_4_ = 0;
  std::
  map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::emplace<uint256,__0>
            ((map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)this_00,(uint256 *)local_228,(anon_enum_32 *)&local_48);
  local_228[0].super_CBlockHeader.nVersion = -0x5e1c6a53;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '^';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xe5;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xff;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0xd5;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x85;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xc5;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xe8;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\x1d';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 'D';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xb5;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 'j';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x98;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x1e';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 0x84;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '-';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '[';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xc3;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\x14'
  ;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\x0f'
  ;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_48._M_impl._0_4_ = 0x801;
  std::
  _Rb_tree<uint256,std::pair<uint256_const,unsigned_int>,std::_Select1st<std::pair<uint256_const,unsigned_int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::_M_emplace_unique<uint256,unsigned_int>
            ((_Rb_tree<uint256,std::pair<uint256_const,unsigned_int>,std::_Select1st<std::pair<uint256_const,unsigned_int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)this_00,(uint256 *)local_228,(uint *)&local_48);
  (this->super_CChainParams).consensus.BIP34Height = 0x37a5b;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xb8;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x9c;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'u';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 'j';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xdd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x15';
  pbVar3 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = 0x91;
  (pbVar3->m_data)._M_elems[9] = 0xb1;
  (pbVar3->m_data)._M_elems[10] = 0xd1;
  (pbVar3->m_data)._M_elems[0xb] = '{';
  (pbVar3->m_data)._M_elems[0xc] = 0xab;
  (pbVar3->m_data)._M_elems[0xd] = 'D';
  (pbVar3->m_data)._M_elems[0xe] = 0xbb;
  (pbVar3->m_data)._M_elems[0xf] = 0xa3;
  pbVar3 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = 0xfe;
  (pbVar3->m_data)._M_elems[0x11] = 0xd9;
  (pbVar3->m_data)._M_elems[0x12] = 0xe0;
  (pbVar3->m_data)._M_elems[0x13] = '/';
  (pbVar3->m_data)._M_elems[0x14] = 0x94;
  (pbVar3->m_data)._M_elems[0x15] = '*';
  (pbVar3->m_data)._M_elems[0x16] = 0xb4;
  (pbVar3->m_data)._M_elems[0x17] = 0x89;
  (this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems[0x18] = 'K';
  (this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       '\x02';
  pbVar3 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  pbVar3 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 0x5ed1d;
  (this->super_CChainParams).consensus.BIP66Height = 0x58ccd;
  (this->super_CChainParams).consensus.CSVHeight = 0x66600;
  (this->super_CChainParams).consensus.SegwitHeight = 0x75a20;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0x76200;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[4] = 0xff;
  (pbVar3->m_data)._M_elems[5] = 0xff;
  (pbVar3->m_data)._M_elems[6] = 0xff;
  (pbVar3->m_data)._M_elems[7] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = 0xff;
  (pbVar3->m_data)._M_elems[9] = 0xff;
  (pbVar3->m_data)._M_elems[10] = 0xff;
  (pbVar3->m_data)._M_elems[0xb] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0xc] = 0xff;
  (pbVar3->m_data)._M_elems[0xd] = 0xff;
  (pbVar3->m_data)._M_elems[0xe] = 0xff;
  (pbVar3->m_data)._M_elems[0xf] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0xc] = 0xff;
  (pbVar3->m_data)._M_elems[0xd] = 0xff;
  (pbVar3->m_data)._M_elems[0xe] = 0xff;
  (pbVar3->m_data)._M_elems[0xf] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = 0xff;
  (pbVar3->m_data)._M_elems[0x11] = 0xff;
  (pbVar3->m_data)._M_elems[0x12] = 0xff;
  (pbVar3->m_data)._M_elems[0x13] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x14] = 0xff;
  (pbVar3->m_data)._M_elems[0x15] = 0xff;
  (pbVar3->m_data)._M_elems[0x16] = 0xff;
  (pbVar3->m_data)._M_elems[0x17] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = 0xff;
  (pbVar3->m_data)._M_elems[0x19] = 0xff;
  (pbVar3->m_data)._M_elems[0x1a] = 0xff;
  (pbVar3->m_data)._M_elems[0x1b] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = false;
  (this->super_CChainParams).consensus.enforce_BIP94 = false;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x717;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = 0x60835f80;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x61131300;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0xad400;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xd6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 'D';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xec;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x93;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 0xc1;
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 'b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x0e';
  pbVar3 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = 0xb7;
  (pbVar3->m_data)._M_elems[9] = 0x86;
  (pbVar3->m_data)._M_elems[10] = 0xe1;
  (pbVar3->m_data)._M_elems[0xb] = 0x88;
  pbVar3 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  pbVar3 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '?';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '&';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 'W';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\x1a';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'O';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xef;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xca;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0x9a;
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = 'X';
  (pbVar3->m_data)._M_elems[9] = 'W';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = 0xce;
  (pbVar3->m_data)._M_elems[0xc] = 0x97;
  (pbVar3->m_data)._M_elems[0xd] = '[';
  (pbVar3->m_data)._M_elems[0xe] = 0xd2;
  (pbVar3->m_data)._M_elems[0xf] = 0xe5;
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = 0xdb;
  (pbVar3->m_data)._M_elems[0x11] = '[';
  (pbVar3->m_data)._M_elems[0x12] = '6';
  (pbVar3->m_data)._M_elems[0x13] = 0x90;
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x14] = 'X';
  (pbVar3->m_data)._M_elems[0x15] = '\x1c';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x16] = '\x01';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x1f] = '\0';
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0xd9b4bef9;
  (this->super_CChainParams).nDefaultPort = 0x208d;
  (this->super_CChainParams).nPruneAfterHeight = 100000;
  (this->super_CChainParams).m_assumed_blockchain_size = 0x26c;
  (this->super_CChainParams).m_assumed_chain_state_size = 0xe;
  local_48._M_impl._0_8_ = 5000000000;
  CreateGenesisBlock(local_228,0x495fab29,0x7c2bac1d,0x1d00ffff,(int32_t)&local_48,in_R9);
  this_01 = &(this->super_CChainParams).genesis;
  CBlock::operator=(this_01,local_228);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_228[0].vtx);
  CBlockHeader::GetHash((uint256 *)local_228,&this_01->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT17(local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x13],CONCAT16(local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                m_data._M_elems[0x12],
                                CONCAT24(local_228[0].super_CBlockHeader.hashPrevBlock.
                                         super_base_blob<256U>.m_data._M_elems._16_2_,
                                         local_228[0].super_CBlockHeader.hashPrevBlock.
                                         super_base_blob<256U>.m_data._M_elems._12_4_)));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) =
       CONCAT17(local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x1b],CONCAT16(local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                m_data._M_elems[0x1a],
                                CONCAT24(local_228[0].super_CBlockHeader.hashPrevBlock.
                                         super_base_blob<256U>.m_data._M_elems._24_2_,
                                         CONCAT13(local_228[0].super_CBlockHeader.hashPrevBlock.
                                                  super_base_blob<256U>.m_data._M_elems[0x17],
                                                  CONCAT12(local_228[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0x16],
                                                           local_228[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems._20_2_)))));
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems =
       CONCAT44(local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                _0_4_,local_228[0].super_CBlockHeader.nVersion);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT44(local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                _8_4_,local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                      _M_elems._4_4_);
  local_228[0].super_CBlockHeader.nVersion = 0xa8ce26f;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xb6;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xf1;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xb3;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 'r';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xc1;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xa6;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xa2;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 'F';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 0xae;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 'c';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xf7;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 'O';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0x93;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\x1e';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 0x83;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 'e';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xe1;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 'Z';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\b';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 0x9c;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = 'h';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0xd6;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\x19'
  ;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  bVar4 = operator==((base_blob<256U> *)this,(base_blob<256U> *)local_228);
  if (!bVar4) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8b,"CMainParams::CMainParams()");
  }
  local_228[0].super_CBlockHeader.nVersion = -0x2125cc5;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 'z';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '{';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\x12';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0xb2;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 'z';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 199;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = ',';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '>';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 'g';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 'v';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0x8f;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 'a';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x7f';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 200;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\x1b';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xc3;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0x88;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0x8a;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 'Q';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '2';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = ':';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0x9f;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 0xb8;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xaa;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 'K';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\x1e'
  ;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '^';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 'J';
  bVar4 = operator==(&(this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                      super_base_blob<256U>,(base_blob<256U> *)local_228);
  if (!bVar4) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8c,"CMainParams::CMainParams()");
  }
  this_02 = &(this->super_CChainParams).vSeeds;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [22])"seed.bitcoin.sipa.be.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [21])"dnsseed.bluematt.me.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[45]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [45])"dnsseed.bitcoin.dashjr-list-of-p2p-nodes.us.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[31]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [31])0x224f0d);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [24])"seed.btc.petertodd.net.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[27]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [27])"seed.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [17])"dnsseed.emzy.de.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [22])"seed.bitcoin.wiz.biz.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [29])"seed.mainnet.achownodes.xyz.");
  local_48._M_impl._0_8_ = local_48._M_impl._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228,1,
             (value_type_conflict *)&local_48,&local_229);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
  local_48._M_impl._0_1_ = (allocator_type)0x5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228,1,
             (value_type_conflict *)&local_48,&local_229);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
  local_48._M_impl._0_1_ = 0x80;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228,1,
             (value_type_conflict *)&local_48,&local_229);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
  local_228[0].super_CBlockHeader.nVersion = 0x1eb28804;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_228,
             &local_228[0].super_CBlockHeader.hashPrevBlock);
  local_228[0].super_CBlockHeader.nVersion = -0x1b5277fc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4),local_228);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&(this->super_CChainParams).bech32_hrp,"bc");
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_228,chainparams_seed_main,
             "g+",(allocator_type *)&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(this->super_CChainParams).vFixedSeeds,local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  memcpy(local_228,&DAT_00231a90,0x1d4);
  __l._M_len = 0xd;
  __l._M_array = (iterator)local_228;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             &local_48,__l,(less<int> *)&local_229,&local_22a);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)&(this->super_CChainParams).checkpointData,&local_48);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree(&local_48);
  local_228[0].super_CBlockHeader.nVersion = 840000;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0x96;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0x8f;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 'v';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\x10';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 's';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 'h';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 'w';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 0x8f;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = ' ';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0x82;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '#';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x9e;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x7f';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 'Q';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\x1a';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\x17';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xb7;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xab;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 0xcc;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 0x8e;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '^';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0x8e;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 0x81;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 'g';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '_';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 0xb6;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = 'Z';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\x1b'
  ;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\x1b'
  ;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = 'R';
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = 0xa5;
  local_228[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = 0xa2;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = 0x82;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = 0xf3;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\x11';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = ';';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = 0xa5;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = 0x83;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = 0xda;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\x1c'
  ;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '?';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = 0xf2;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = 0x9b;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = 'h';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = 'r';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = 'H';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = 0xff;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = 's';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = 'x';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\"';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xf8;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = 0xce;
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = 'H';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\'';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] =
       '\x03';
  local_228[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = ':';
  local_228[0].super_CBlockHeader.nTime._0_2_ = 0x2028;
  local_228[0].super_CBlockHeader.nTime._2_1_ = 3;
  local_228[0].super_CBlockHeader._71_8_ = 0;
  local_228[0].super_CBlockHeader.nNonce._3_1_ = 0;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,local_228);
  (this->super_CChainParams).chainTxData.nTime = 0x66bccc78;
  (this->super_CChainParams).chainTxData.tx_count = 0x3f23d4b5;
  (this->super_CChainParams).chainTxData.dTxRate = 6.721086701157182;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CMainParams() {
        m_chain_type = ChainType::MAIN;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.script_flag_exceptions.emplace( // BIP16 exception
            uint256{"00000000000002dc756eebf4f49723ed8d30cc28a5f108eb94b1ba88ac4f9c22"}, SCRIPT_VERIFY_NONE);
        consensus.script_flag_exceptions.emplace( // Taproot exception
            uint256{"0000000000000000000f14c35b2d841e986ab5441de8c585d5ffe55ea1e395ad"}, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS);
        consensus.BIP34Height = 227931;
        consensus.BIP34Hash = uint256{"000000000000024b89b42a942fe0d9fea3bb44ab7bd1b19115dd6a759c0808b8"};
        consensus.BIP65Height = 388381; // 000000000000000004c2b624ed5d7756c508d90fd0da2c7c679febfa6c4735f0
        consensus.BIP66Height = 363725; // 00000000000000000379eaa19dce8c9b722d46ae6a57c2f1a988119488b50931
        consensus.CSVHeight = 419328; // 000000000000000004a1b34462cb8aeebd5799177f7a29cf28f2d1961716b5b5
        consensus.SegwitHeight = 481824; // 0000000000000000001c8018d9cb3b742ef25114f27563e3fc4a1902167f9893
        consensus.MinBIP9WarningHeight = 483840; // segwit activation height + miner confirmation window
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = false;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1815; // 90% of 2016
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = 1619222400; // April 24th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = 1628640000; // August 11th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 709632; // Approximately November 12th, 2021

        consensus.nMinimumChainWork = uint256{"000000000000000000000000000000000000000088e186b70e0862c193ec44d6"};
        consensus.defaultAssumeValid = uint256{"000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f"}; // 856760

        /**
         * The message start string is designed to be unlikely to occur in normal data.
         * The characters are rarely used upper ASCII, not valid as UTF-8, and produce
         * a large 32-bit integer with any alignment.
         */
        pchMessageStart[0] = 0xf9;
        pchMessageStart[1] = 0xbe;
        pchMessageStart[2] = 0xb4;
        pchMessageStart[3] = 0xd9;
        nDefaultPort = 8333;
        nPruneAfterHeight = 100000;
        m_assumed_blockchain_size = 620;
        m_assumed_chain_state_size = 14;

        genesis = CreateGenesisBlock(1231006505, 2083236893, 0x1d00ffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        // Note that of those which support the service bits prefix, most only support a subset of
        // possible options.
        // This is fine at runtime as we'll fall back to using them as an addrfetch if they don't support the
        // service bits we want, but we should get them updated to support all service bits wanted by any
        // release ASAP to avoid it where possible.
        vSeeds.emplace_back("seed.bitcoin.sipa.be."); // Pieter Wuille, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("dnsseed.bluematt.me."); // Matt Corallo, only supports x9
        vSeeds.emplace_back("dnsseed.bitcoin.dashjr-list-of-p2p-nodes.us."); // Luke Dashjr
        vSeeds.emplace_back("seed.bitcoin.jonasschnelli.ch."); // Jonas Schnelli, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.btc.petertodd.net."); // Peter Todd, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("dnsseed.emzy.de."); // Stephan Oeste
        vSeeds.emplace_back("seed.bitcoin.wiz.biz."); // Jason Maurice
        vSeeds.emplace_back("seed.mainnet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,0);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,5);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,128);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x88, 0xB2, 0x1E};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x88, 0xAD, 0xE4};

        bech32_hrp = "bc";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_main), std::end(chainparams_seed_main));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                { 11111, uint256{"0000000069e244f73d78e8fd29ba2fd2ed618bd6fa2ee92559f542fdb26e7c1d"}},
                { 33333, uint256{"000000002dd5588a74784eaa7ab0507a18ad16a236e7b1ce69f00d7ddfb5d0a6"}},
                { 74000, uint256{"0000000000573993a3c9e41ce34471c079dcf5f52a0e824a81e7f953b8661a20"}},
                {105000, uint256{"00000000000291ce28027faea320c8d2b054b2e0fe44a773f3eefb151d6bdc97"}},
                {134444, uint256{"00000000000005b12ffd4cd315cd34ffd4a594f430ac814c91184a0d42d2b0fe"}},
                {168000, uint256{"000000000000099e61ea72015e79632f216fe6cb33d7899acb35b75c8303b763"}},
                {193000, uint256{"000000000000059f452a5f7340de6682a977387c17010ff6e6c3bd83ca8b1317"}},
                {210000, uint256{"000000000000048b95347e83192f69cf0366076336c639f9b7228e9ba171342e"}},
                {216116, uint256{"00000000000001b4f4b433e81ee46494af945cf96014816a4e2370f11b23df4e"}},
                {225430, uint256{"00000000000001c108384350f74090433e7fcf79a606b8e797f065b130575932"}},
                {250000, uint256{"000000000000003887df1f29024b06fc2200b55f8af8f35453d7be294df2d214"}},
                {279000, uint256{"0000000000000001ae8c72a0b0c301f67e3afca10e819efa9041e458e9bd7e40"}},
                {295000, uint256{"00000000000000004d9b4ef50f0f9d686fd69db2e03af35a100370c64632a983"}},
            }
        };

        m_assumeutxo_data = {
            {
                .height = 840'000,
                .hash_serialized = AssumeutxoHash{uint256{"a2a5521b1b5ab65f67818e5e8eccabb7171a517f9e2382208f77687310768f96"}},
                .m_chain_tx_count = 991032194,
                .blockhash = consteval_ctor(uint256{"0000000000000000000320283a032748cef8227873ff4872689bf23f1cda83a5"}),
            }
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f
            .nTime    = 1723649144,
            .tx_count = 1059312821,
            .dTxRate  = 6.721086701157182,
        };
    }